

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_fruit.cpp
# Opt level: O3

void use_fruit(void)

{
  Banana c;
  Banana b;
  Banana BStack_38;
  Banana local_20;
  
  L13_4::Banana::Banana(&local_20,"b0","b0-class");
  L13_4::operator<<((ostream *)&std::cout,&local_20);
  L13_4::operator<<((ostream *)&std::cout,&local_20.super_Fruit);
  L13_4::Banana::Banana(&BStack_38,"C0","C0-class");
  L13_4::operator<<((ostream *)&std::cout,&BStack_38);
  L13_4::Banana::operator=(&BStack_38,&local_20);
  L13_4::operator<<((ostream *)&std::cout,&BStack_38);
  L13_4::Banana::~Banana(&BStack_38);
  L13_4::Banana::~Banana(&local_20);
  return;
}

Assistant:

void use_fruit() {
    //
    using namespace L13_4;
    using std::cout;
    using std::endl;

    Banana b("b0", "b0-class");
    //  默认是调用衍生类的友元重载运算符方法
    cout << b;

    //  只调用其基类的友元重载运算符方法
    cout << (const Fruit &)b;

    Banana c("C0", "C0-class");

    cout << c;

    c = b;

    cout << c;
}